

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncsd.c
# Opt level: O3

int ncsd_open(NCSDContext *context,char *filename)

{
  ExHeader *exheader;
  byte bVar1;
  FILE *__stream;
  FILE *__stream_00;
  uint8_t *puVar2;
  int i;
  long lVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint128 key_;
  uint128 key_y;
  uint128 local_78;
  uint128 local_68;
  uint128 local_58;
  uint8_t local_48;
  uint8_t uStack_47;
  uint8_t uStack_46;
  uint8_t uStack_45;
  uint8_t uStack_44;
  uint8_t uStack_43;
  uint8_t uStack_42;
  uint8_t uStack_41;
  uint8_t uStack_40;
  uint8_t uStack_3f;
  uint8_t uStack_3e;
  uint8_t uStack_3d;
  uint8_t uStack_3c;
  uint8_t uStack_3b;
  uint8_t uStack_3a;
  uint8_t uStack_39;
  
  __stream_00 = fopen64(filename,"rb");
  if (__stream_00 == (FILE *)0x0) {
    iVar4 = -1;
  }
  else {
    context->fd = __stream_00;
    fread(&context->header,0x200,1,__stream_00);
    if (*(int *)(context->header).magic == 0x4453434e) {
      __stream = (FILE *)context->fd;
      fseeko64(__stream,(ulong)(context->header).partition_geometry[0].offset << 9,0);
      fread(&context->ncch,0x200,1,__stream);
      iVar4 = -3;
      if (*(int *)(context->ncch).magic == 0x4843434e) {
        exheader = &context->exheader;
        fread(exheader,0x800,1,__stream);
        bVar1 = (context->ncch).flags[7];
        if ((bVar1 & 4) == 0) {
          if ((bVar1 & 1) == 0) {
            local_68.lowpart = 0x24591dc5d52768a;
            local_68.highpart = 0x1ff9e9aac5fe0408;
            local_58.lowpart = *(uint64_t *)(context->ncch).signature;
            local_58.highpart = *(uint64_t *)((context->ncch).signature + 8);
            uint128_bswap(&local_58);
            local_78 = slot_0x2C_key;
            uint128_rol(&local_78,2);
            uint128_xor(&local_78,&local_58);
            uint128_add(&local_78,&local_68);
            uint128_rol(&local_78,0x57);
            puVar2 = context->calc_key;
            lVar3 = 0x38;
            do {
              *puVar2 = (uint8_t)(local_78.highpart >> ((byte)lVar3 & 0x3f));
              puVar2 = puVar2 + 1;
              lVar3 = lVar3 + -8;
            } while (lVar3 != -8);
            lVar3 = 0x38;
            do {
              *puVar2 = (uint8_t)(local_78.lowpart >> ((byte)lVar3 & 0x3f));
              puVar2 = puVar2 + 1;
              lVar3 = lVar3 + -8;
            } while (lVar3 != -8);
            context->encrypted = 1;
          }
          else {
            context->calc_key[0] = '\0';
            context->calc_key[1] = '\0';
            context->calc_key[2] = '\0';
            context->calc_key[3] = '\0';
            context->calc_key[4] = '\0';
            context->calc_key[5] = '\0';
            context->calc_key[6] = '\0';
            context->calc_key[7] = '\0';
            context->calc_key[8] = '\0';
            context->calc_key[9] = '\0';
            context->calc_key[10] = '\0';
            context->calc_key[0xb] = '\0';
            context->calc_key[0xc] = '\0';
            context->calc_key[0xd] = '\0';
            context->calc_key[0xe] = '\0';
            context->calc_key[0xf] = '\0';
            context->encrypted = 2;
          }
        }
        else {
          context->encrypted = 0;
        }
        ncsd_crypt_exheader(context,exheader);
        ncch_exheader_get_hash(exheader,(uint8_t *)&local_58);
        auVar6[0] = -((context->ncch).extended_header_hash[0x10] == local_48);
        auVar6[1] = -((context->ncch).extended_header_hash[0x11] == uStack_47);
        auVar6[2] = -((context->ncch).extended_header_hash[0x12] == uStack_46);
        auVar6[3] = -((context->ncch).extended_header_hash[0x13] == uStack_45);
        auVar6[4] = -((context->ncch).extended_header_hash[0x14] == uStack_44);
        auVar6[5] = -((context->ncch).extended_header_hash[0x15] == uStack_43);
        auVar6[6] = -((context->ncch).extended_header_hash[0x16] == uStack_42);
        auVar6[7] = -((context->ncch).extended_header_hash[0x17] == uStack_41);
        auVar6[8] = -((context->ncch).extended_header_hash[0x18] == uStack_40);
        auVar6[9] = -((context->ncch).extended_header_hash[0x19] == uStack_3f);
        auVar6[10] = -((context->ncch).extended_header_hash[0x1a] == uStack_3e);
        auVar6[0xb] = -((context->ncch).extended_header_hash[0x1b] == uStack_3d);
        auVar6[0xc] = -((context->ncch).extended_header_hash[0x1c] == uStack_3c);
        auVar6[0xd] = -((context->ncch).extended_header_hash[0x1d] == uStack_3b);
        auVar6[0xe] = -((context->ncch).extended_header_hash[0x1e] == uStack_3a);
        auVar6[0xf] = -((context->ncch).extended_header_hash[0x1f] == uStack_39);
        auVar5[0] = -((context->ncch).extended_header_hash[0] == (uint8_t)local_58.lowpart);
        auVar5[1] = -((context->ncch).extended_header_hash[1] == local_58.lowpart._1_1_);
        auVar5[2] = -((context->ncch).extended_header_hash[2] == local_58.lowpart._2_1_);
        auVar5[3] = -((context->ncch).extended_header_hash[3] == local_58.lowpart._3_1_);
        auVar5[4] = -((context->ncch).extended_header_hash[4] == local_58.lowpart._4_1_);
        auVar5[5] = -((context->ncch).extended_header_hash[5] == local_58.lowpart._5_1_);
        auVar5[6] = -((context->ncch).extended_header_hash[6] == local_58.lowpart._6_1_);
        auVar5[7] = -((context->ncch).extended_header_hash[7] == local_58.lowpart._7_1_);
        auVar5[8] = -((context->ncch).extended_header_hash[8] == (uint8_t)local_58.highpart);
        auVar5[9] = -((context->ncch).extended_header_hash[9] == local_58.highpart._1_1_);
        auVar5[10] = -((context->ncch).extended_header_hash[10] == local_58.highpart._2_1_);
        auVar5[0xb] = -((context->ncch).extended_header_hash[0xb] == local_58.highpart._3_1_);
        auVar5[0xc] = -((context->ncch).extended_header_hash[0xc] == local_58.highpart._4_1_);
        auVar5[0xd] = -((context->ncch).extended_header_hash[0xd] == local_58.highpart._5_1_);
        auVar5[0xe] = -((context->ncch).extended_header_hash[0xe] == local_58.highpart._6_1_);
        auVar5[0xf] = -((context->ncch).extended_header_hash[0xf] == local_58.highpart._7_1_);
        auVar5 = auVar5 & auVar6;
        iVar4 = -4;
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
          return 0;
        }
      }
      fclose(__stream_00);
    }
    else {
      fclose(__stream_00);
      iVar4 = -2;
    }
  }
  return iVar4;
}

Assistant:

int ncsd_open(NCSDContext *context, const char *filename) {
    FILE *fd = fopen(filename, "rb");
    int result;
    if (fd == NULL) return NCSD_FILE_NOT_FOUND;
    context->fd = fd;
    fread(&context->header, sizeof(NCSDHeader), 1, fd);
    if (memcmp(context->header.magic, "NCSD", 4) != 0) {
        fclose(fd);
        return NCSD_INVALID_NCSD_HEADER;
    }
    result = read_ncch(context);
    if (result != NCSD_OK) {
        fclose(fd);
        return result;
    }
    return NCSD_OK;
}